

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O1

void __thiscall QCborStreamReader::QCborStreamReader(QCborStreamReader *this,QByteArray *data)

{
  QCborStreamReaderPrivate *this_00;
  
  this_00 = (QCborStreamReaderPrivate *)operator_new(0x78);
  QCborStreamReaderPrivate::QCborStreamReaderPrivate(this_00,data);
  *(QCborStreamReaderPrivate **)(this + 8) = this_00;
  *(undefined2 *)(this + 0x11) = 0;
  this[0x13] = (QCborStreamReader)0x0;
  preparse(this);
  return;
}

Assistant:

QCborStreamReader::QCborStreamReader(const QByteArray &data)
    : d(new QCborStreamReaderPrivate(data))
{
    preparse();
}